

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

void Vec_BitSetEntry(Vec_Bit_t *p,int i,int Entry)

{
  int Entry_local;
  int i_local;
  Vec_Bit_t *p_local;
  
  Vec_BitFillExtra(p,i + 1,0);
  Vec_BitWriteEntry(p,i,Entry);
  return;
}

Assistant:

static inline void Vec_BitSetEntry( Vec_Bit_t * p, int i, int Entry )
{
    Vec_BitFillExtra( p, i + 1, 0 );
    Vec_BitWriteEntry( p, i, Entry );
}